

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O3

void __thiscall
duckdb::CSVReaderOptions::SetReadOption
          (CSVReaderOptions *this,string *loption,Value *value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *expected_names)

{
  _Bit_iterator *p_Var1;
  pointer pVVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  InvalidInputException *pIVar7;
  vector<duckdb::Value,_true> *pvVar8;
  int64_t iVar9;
  unsigned_long uVar10;
  BinderException *pBVar11;
  __hashtable *__h;
  string *this_00;
  undefined1 *puVar12;
  undefined1 *puVar13;
  pointer this_01;
  string table_name;
  vector<bool,_true> local_118;
  string local_f0;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar4 = SetBaseOption(this,loption,value,false);
  if (bVar4) {
    return;
  }
  iVar5 = ::std::__cxx11::string::compare((char *)loption);
  if (iVar5 == 0) {
    bVar4 = ParseBoolean(value,loption);
    this->auto_detect = bVar4;
    return;
  }
  iVar5 = ::std::__cxx11::string::compare((char *)loption);
  if (iVar5 == 0) {
    uVar6 = ParseInteger(value,loption);
    if (uVar6 != 0xffffffffffffffff && (long)uVar6 < 1) {
      pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
      local_118.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
           (_Bit_type *)
           &local_118.super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,
                 "Unsupported parameter for SAMPLE_SIZE: cannot be smaller than 1","");
      BinderException::BinderException(pBVar11,(string *)&local_118);
      __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (uVar6 != 0xffffffffffffffff) {
      uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar6 >> 0xb);
      this->sample_size_chunks = uVar10;
      if ((uVar6 & 0x7ff) == 0) {
        return;
      }
      this->sample_size_chunks = uVar10 + 1;
      return;
    }
    this->sample_size_chunks = 0xffffffffffffffff;
    return;
  }
  iVar5 = ::std::__cxx11::string::compare((char *)loption);
  if (iVar5 == 0) {
    iVar9 = ParseInteger(value,loption);
    SetSkipRows(this,iVar9);
    return;
  }
  iVar5 = ::std::__cxx11::string::compare((char *)loption);
  if ((iVar5 == 0) || (iVar5 = ::std::__cxx11::string::compare((char *)loption), iVar5 == 0)) {
    iVar9 = ParseInteger(value,loption);
    if (iVar9 < 0) {
      pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
      local_118.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
           (_Bit_type *)
           &local_118.super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,
                 "Invalid value for MAX_LINE_SIZE parameter: it cannot be smaller than 0","");
      BinderException::BinderException(pBVar11,(string *)&local_118);
      __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar9);
    if ((this->maximum_line_size).set_by_user == false) {
      (this->maximum_line_size).value = uVar10;
      (this->maximum_line_size).set_by_user = true;
    }
    if ((this->buffer_size_option).set_by_user != true) {
      return;
    }
    if ((this->maximum_line_size).value <= (this->buffer_size_option).value) {
      return;
    }
    pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_118.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)
         &local_118.super_vector<bool,_std::allocator<bool>_>.
          super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,
               "Buffer Size of %d must be a higher value than the maximum line size %d","");
    InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
              (pIVar7,(string *)&local_118,(this->buffer_size_option).value,
               (this->maximum_line_size).value);
    __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar5 = ::std::__cxx11::string::compare((char *)loption);
  if ((iVar5 == 0) || (iVar5 = ::std::__cxx11::string::compare((char *)loption), iVar5 == 0)) {
    ParseString((string *)&local_118,value,loption);
    SetDateFormat(this,DATE,(string *)&local_118,true);
  }
  else {
    iVar5 = ::std::__cxx11::string::compare((char *)loption);
    if ((iVar5 == 0) || (iVar5 = ::std::__cxx11::string::compare((char *)loption), iVar5 == 0)) {
      ParseString((string *)&local_118,value,loption);
      SetDateFormat(this,TIMESTAMP,(string *)&local_118,true);
    }
    else {
      iVar5 = ::std::__cxx11::string::compare((char *)loption);
      if (iVar5 == 0) {
        bVar4 = ParseBoolean(value,loption);
        if ((this->ignore_errors).set_by_user != false) {
          return;
        }
        (this->ignore_errors).value = bVar4;
        (this->ignore_errors).set_by_user = true;
        return;
      }
      iVar5 = ::std::__cxx11::string::compare((char *)loption);
      if (iVar5 == 0) {
        iVar9 = ParseInteger(value,loption);
        uVar6 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar9);
        if ((this->buffer_size_option).set_by_user == true) {
          uVar6 = (this->buffer_size_option).value;
        }
        else {
          (this->buffer_size_option).value = uVar6;
          (this->buffer_size_option).set_by_user = true;
        }
        if (uVar6 == 0) {
          pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_118.super_vector<bool,_std::allocator<bool>_>.
          super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
          super__Bit_iterator_base._M_p =
               (_Bit_type *)
               &local_118.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,"Buffer Size option must be higher than 0","");
          InvalidInputException::InvalidInputException(pIVar7,(string *)&local_118);
          __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->maximum_line_size).set_by_user != true) {
          (this->maximum_line_size).value = uVar6;
          (this->maximum_line_size).set_by_user = false;
          return;
        }
        if ((this->maximum_line_size).value <= uVar6) {
          return;
        }
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_118.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p =
             (_Bit_type *)
             &local_118.super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,
                   "Buffer Size of %d must be a higher value than the maximum line size %d","");
        InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                  (pIVar7,(string *)&local_118,(this->buffer_size_option).value,
                   (this->maximum_line_size).value);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar5 = ::std::__cxx11::string::compare((char *)loption);
      if (iVar5 == 0) {
        ParseString((string *)&local_118,value,loption);
        this_00 = &this->decimal_separator;
        ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_118);
        p_Var1 = &local_118.super_vector<bool,_std::allocator<bool>_>.
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_finish;
        if ((_Bit_iterator *)
            local_118.super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._M_p != p_Var1) {
          operator_delete(local_118.super_vector<bool,_std::allocator<bool>_>.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
        iVar5 = ::std::__cxx11::string::compare((char *)this_00);
        if (iVar5 == 0) {
          return;
        }
        iVar5 = ::std::__cxx11::string::compare((char *)this_00);
        if (iVar5 == 0) {
          return;
        }
        pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
        local_118.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p = (_Bit_type *)p_Var1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,
                   "Unsupported parameter for DECIMAL_SEPARATOR: should be \'.\' or \',\'","");
        BinderException::BinderException(pBVar11,(string *)&local_118);
        __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar5 = ::std::__cxx11::string::compare((char *)loption);
      if (iVar5 == 0) {
        bVar4 = ParseBoolean(value,loption);
        this->null_padding = bVar4;
        return;
      }
      iVar5 = ::std::__cxx11::string::compare((char *)loption);
      if (iVar5 == 0) {
        bVar4 = ParseBoolean(value,loption);
        this->parallel = bVar4;
        return;
      }
      iVar5 = ::std::__cxx11::string::compare((char *)loption);
      if (iVar5 == 0) {
        bVar4 = ParseBoolean(value,loption);
        this->allow_quoted_nulls = bVar4;
        return;
      }
      iVar5 = ::std::__cxx11::string::compare((char *)loption);
      if (iVar5 == 0) {
        bVar4 = ParseBoolean(value,loption);
        if ((this->store_rejects).set_by_user != false) {
          return;
        }
        (this->store_rejects).value = bVar4;
        (this->store_rejects).set_by_user = true;
        return;
      }
      iVar5 = ::std::__cxx11::string::compare((char *)loption);
      if (iVar5 == 0) {
        if ((expected_names->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (expected_names->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ParseColumnList(&local_118,value,expected_names,loption);
          ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
                    ((_Bvector_base<std::allocator<bool>_> *)&this->force_not_null);
          (this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
          super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage =
               local_118.super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
          (this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
          super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
          super__Bit_iterator_base._M_p =
               local_118.super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p;
          *(undefined8 *)
           ((long)&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) =
               local_118.super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._8_8_;
          (this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
          super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
          super__Bit_iterator_base._M_p =
               local_118.super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p;
          *(undefined8 *)
           ((long)&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) =
               local_118.super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._8_8_;
          return;
        }
        if (value->is_null != true) {
          pvVar8 = ListValue::GetChildren(value);
          this_01 = (pvVar8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pVVar2 = (pvVar8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (this_01 == pVVar2) {
            return;
          }
          do {
            Value::GetValue<std::__cxx11::string>((string *)&local_118,this_01);
            local_f0._M_dataplus._M_p = (pointer)&this->force_not_null_names;
            ::std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&this->force_not_null_names,&local_118,&local_f0);
            if ((_Bit_iterator *)
                local_118.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._M_p !=
                &local_118.super_vector<bool,_std::allocator<bool>_>.
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_finish) {
              operator_delete(local_118.super_vector<bool,_std::allocator<bool>_>.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            }
            this_01 = this_01 + 1;
          } while (this_01 != pVVar2);
          return;
        }
        pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
        local_118.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p =
             (_Bit_type *)
             &local_118.super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"Invalid value for \'force_not_null\' paramenter","");
        BinderException::BinderException(pBVar11,(string *)&local_118);
        __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar5 = ::std::__cxx11::string::compare((char *)loption);
      if (iVar5 == 0) {
        ParseString((string *)&local_118,value,loption);
        if (local_118.super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._8_8_ == 0) {
          pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"REJECTS_TABLE option cannot be empty","");
          BinderException::BinderException(pBVar11,&local_f0);
          __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar4 = KeywordHelper::RequiresQuotes((string *)&local_118,true);
        if (bVar4) {
          pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,
                     "rejects_scan option: %s requires quotes to be used as an identifier","");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,
                     local_118.super_vector<bool,_std::allocator<bool>_>.
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p,
                     (pointer)((long)local_118.super_vector<bool,_std::allocator<bool>_>.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              + local_118.super_vector<bool,_std::allocator<bool>_>.
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_));
          BinderException::BinderException<std::__cxx11::string>(pBVar11,&local_f0,&local_50);
          __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        puVar13 = local_a0;
        local_b0[0] = puVar13;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,
                   local_118.super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._M_p,
                   (pointer)((long)local_118.super_vector<bool,_std::allocator<bool>_>.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                            local_118.super_vector<bool,_std::allocator<bool>_>.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_));
        puVar12 = local_b0[0];
        if ((this->rejects_table_name).set_by_user == false) {
          ::std::__cxx11::string::_M_assign((string *)&(this->rejects_table_name).value);
          (this->rejects_table_name).set_by_user = true;
          puVar12 = local_b0[0];
        }
      }
      else {
        iVar5 = ::std::__cxx11::string::compare((char *)loption);
        if (iVar5 != 0) {
          iVar5 = ::std::__cxx11::string::compare((char *)loption);
          if (iVar5 == 0) {
            iVar9 = ParseInteger(value,loption);
            if (-1 < iVar9) {
              uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar9);
              this->rejects_limit = uVar10;
              return;
            }
            pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
            local_118.super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 &local_118.super_vector<bool,_std::allocator<bool>_>.
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_finish;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,
                       "Unsupported parameter for REJECTS_LIMIT: cannot be negative","");
            BinderException::BinderException(pBVar11,(string *)&local_118);
            __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          iVar5 = ::std::__cxx11::string::compare((char *)loption);
          if (iVar5 != 0) {
            pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
            local_118.super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 &local_118.super_vector<bool,_std::allocator<bool>_>.
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_finish;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,"Unrecognized option for CSV reader \"%s\"","");
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            pcVar3 = (loption->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar3,pcVar3 + loption->_M_string_length);
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar11,(string *)&local_118,&local_90);
            __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          ParseString((string *)&local_118,value,loption);
          ::std::__cxx11::string::operator=((string *)&this->encoding,(string *)&local_118);
          goto LAB_01683a15;
        }
        ParseString((string *)&local_118,value,loption);
        if (local_118.super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._8_8_ == 0) {
          pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"rejects_scan option cannot be empty","");
          BinderException::BinderException(pBVar11,&local_f0);
          __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar4 = KeywordHelper::RequiresQuotes((string *)&local_118,true);
        if (bVar4) {
          pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,
                     "rejects_scan option: %s requires quotes to be used as an identifier","");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,
                     local_118.super_vector<bool,_std::allocator<bool>_>.
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p,
                     (pointer)((long)local_118.super_vector<bool,_std::allocator<bool>_>.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              + local_118.super_vector<bool,_std::allocator<bool>_>.
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_));
          BinderException::BinderException<std::__cxx11::string>(pBVar11,&local_f0,&local_70);
          __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        puVar13 = local_c0;
        local_d0[0] = puVar13;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,
                   local_118.super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._M_p,
                   (pointer)((long)local_118.super_vector<bool,_std::allocator<bool>_>.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                            local_118.super_vector<bool,_std::allocator<bool>_>.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_));
        puVar12 = local_d0[0];
        if ((this->rejects_scan_name).set_by_user == false) {
          ::std::__cxx11::string::_M_assign((string *)&(this->rejects_scan_name).value);
          (this->rejects_scan_name).set_by_user = true;
          puVar12 = local_d0[0];
        }
      }
      if (puVar12 != puVar13) {
        operator_delete(puVar12);
      }
    }
  }
LAB_01683a15:
  if ((_Bit_iterator *)
      local_118.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
      &local_118.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish) {
    operator_delete(local_118.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void CSVReaderOptions::SetReadOption(const string &loption, const Value &value, vector<string> &expected_names) {
	if (SetBaseOption(loption, value)) {
		return;
	}
	if (loption == "auto_detect") {
		auto_detect = ParseBoolean(value, loption);
	} else if (loption == "sample_size") {
		const auto sample_size_option = ParseInteger(value, loption);
		if (sample_size_option < 1 && sample_size_option != -1) {
			throw BinderException("Unsupported parameter for SAMPLE_SIZE: cannot be smaller than 1");
		}
		if (sample_size_option == -1) {
			// If -1, we basically read the whole thing
			sample_size_chunks = NumericLimits<idx_t>().Maximum();
		} else {
			sample_size_chunks = NumericCast<idx_t>(sample_size_option / STANDARD_VECTOR_SIZE);
			if (sample_size_option % STANDARD_VECTOR_SIZE != 0) {
				sample_size_chunks++;
			}
		}

	} else if (loption == "skip") {
		SetSkipRows(ParseInteger(value, loption));
	} else if (loption == "max_line_size" || loption == "maximum_line_size") {
		auto line_size = ParseInteger(value, loption);
		if (line_size < 0) {
			throw BinderException("Invalid value for MAX_LINE_SIZE parameter: it cannot be smaller than 0");
		}
		maximum_line_size.Set(NumericCast<idx_t>(line_size));
		if (buffer_size_option.IsSetByUser() && maximum_line_size.GetValue() > buffer_size_option.GetValue()) {
			throw InvalidInputException("Buffer Size of %d must be a higher value than the maximum line size %d",
			                            buffer_size_option.GetValue(), maximum_line_size.GetValue());
		}
	} else if (loption == "date_format" || loption == "dateformat") {
		string format = ParseString(value, loption);
		SetDateFormat(LogicalTypeId::DATE, format, true);
	} else if (loption == "timestamp_format" || loption == "timestampformat") {
		string format = ParseString(value, loption);
		SetDateFormat(LogicalTypeId::TIMESTAMP, format, true);
	} else if (loption == "ignore_errors") {
		ignore_errors.Set(ParseBoolean(value, loption));
	} else if (loption == "buffer_size") {
		buffer_size_option.Set(NumericCast<idx_t>(ParseInteger(value, loption)));
		if (buffer_size_option == 0) {
			throw InvalidInputException("Buffer Size option must be higher than 0");
		}
		if (maximum_line_size.IsSetByUser() && maximum_line_size.GetValue() > buffer_size_option.GetValue()) {
			throw InvalidInputException("Buffer Size of %d must be a higher value than the maximum line size %d",
			                            buffer_size_option.GetValue(), maximum_line_size.GetValue());
		} else {
			maximum_line_size.Set(buffer_size_option.GetValue(), false);
		}
	} else if (loption == "decimal_separator") {
		decimal_separator = ParseString(value, loption);
		if (decimal_separator != "." && decimal_separator != ",") {
			throw BinderException("Unsupported parameter for DECIMAL_SEPARATOR: should be '.' or ','");
		}
	} else if (loption == "null_padding") {
		null_padding = ParseBoolean(value, loption);
	} else if (loption == "parallel") {
		parallel = ParseBoolean(value, loption);
	} else if (loption == "allow_quoted_nulls") {
		allow_quoted_nulls = ParseBoolean(value, loption);
	} else if (loption == "store_rejects") {
		store_rejects.Set(ParseBoolean(value, loption));
	} else if (loption == "force_not_null") {
		if (!expected_names.empty()) {
			force_not_null = ParseColumnList(value, expected_names, loption);
		} else {
			if (value.IsNull()) {
				throw BinderException("Invalid value for 'force_not_null' paramenter");
			}
			// Get the list of columns to use as a recovery key
			auto &children = ListValue::GetChildren(value);
			for (auto &child : children) {
				auto col_name = child.GetValue<string>();
				force_not_null_names.insert(col_name);
			}
		}

	} else if (loption == "rejects_table") {
		// skip, handled in SetRejectsOptions
		auto table_name = ParseString(value, loption);
		if (table_name.empty()) {
			throw BinderException("REJECTS_TABLE option cannot be empty");
		}
		if (KeywordHelper::RequiresQuotes(table_name)) {
			throw BinderException("rejects_scan option: %s requires quotes to be used as an identifier", table_name);
		}
		rejects_table_name.Set(table_name);
	} else if (loption == "rejects_scan") {
		// skip, handled in SetRejectsOptions
		auto table_name = ParseString(value, loption);
		if (table_name.empty()) {
			throw BinderException("rejects_scan option cannot be empty");
		}
		if (KeywordHelper::RequiresQuotes(table_name)) {
			throw BinderException("rejects_scan option: %s requires quotes to be used as an identifier", table_name);
		}
		rejects_scan_name.Set(table_name);
	} else if (loption == "rejects_limit") {
		auto limit = ParseInteger(value, loption);
		if (limit < 0) {
			throw BinderException("Unsupported parameter for REJECTS_LIMIT: cannot be negative");
		}
		rejects_limit = NumericCast<idx_t>(limit);
	} else if (loption == "encoding") {
		encoding = ParseString(value, loption);
	} else {
		throw BinderException("Unrecognized option for CSV reader \"%s\"", loption);
	}
}